

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O2

bool __thiscall
Memory::HeapBlockMap64::EnsureHeapBlock(HeapBlockMap64 *this,void *address,size_t pageCount)

{
  bool bVar1;
  Node *pNVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = 0x100000 - ((uint)((ulong)address >> 0xc) & 0xfffff);
  uVar4 = pageCount & 0xffffffff;
  if (uVar3 <= pageCount) {
    uVar4 = (ulong)uVar3;
  }
  while ((pNVar2 = FindOrInsertNode(this,address), pNVar2 != (Node *)0x0 &&
         (bVar1 = HeapBlockMap32::EnsureHeapBlock(&pNVar2->map,address,(uint)uVar4), bVar1))) {
    pageCount = pageCount - (uVar4 & 0xffffffff);
    if (pageCount == 0) {
      return true;
    }
    address = (void *)((long)address + (uVar4 & 0xffffffff) * 0x1000);
    uVar4 = 0x100000;
    if (pageCount < 0x100000) {
      uVar4 = pageCount;
    }
  }
  return false;
}

Assistant:

bool
HeapBlockMap64::EnsureHeapBlock(void * address, size_t pageCount)
{
    uint lowerBitsAddress = ::Math::PointerCastToIntegralTruncate<uint>(address);
    size_t pageCountLeft = pageCount;
    uint nodePages = HeapBlockMap64::PagesPer4GB - lowerBitsAddress / AutoSystemInfo::PageSize;
    if (pageCountLeft < nodePages)
    {
        nodePages = (uint)pageCountLeft;
    }

    do
    {
        Node * node = FindOrInsertNode(address);
        if (node == nullptr || !node->map.EnsureHeapBlock(address, nodePages))
        {
            return false;
        }

        pageCountLeft -= nodePages;
        if (pageCountLeft == 0)
        {
            return true;
        }
        address = (void *)((size_t)address + ((size_t)nodePages * AutoSystemInfo::PageSize));
        nodePages = HeapBlockMap64::PagesPer4GB;
        if (pageCountLeft < HeapBlockMap64::PagesPer4GB)
        {
            nodePages = (uint)pageCountLeft;
        }
    }
    while (true);
}